

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere_info.cpp
# Opt level: O0

ostream * CS248::Collada::operator<<(ostream *os,SphereInfo *sphere)

{
  ostream *poVar1;
  long in_RSI;
  ostream *in_RDI;
  
  poVar1 = std::operator<<(in_RDI,"Sphere: ");
  poVar1 = std::operator<<(poVar1,(string *)(in_RSI + 0x28));
  poVar1 = std::operator<<(poVar1," (id:");
  poVar1 = std::operator<<(poVar1,(string *)(in_RSI + 8));
  poVar1 = std::operator<<(poVar1,") [");
  poVar1 = std::operator<<(poVar1," radius=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(float *)(in_RSI + 0x48));
  poVar1 = std::operator<<(poVar1," ]");
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const SphereInfo& sphere) {
  return os << "Sphere: " << sphere.name << " (id:" << sphere.id << ") ["
            << " radius=" << sphere.radius << " ]";
}